

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_checkScalingFactorImportedModel_Test::TestBody
          (Units_checkScalingFactorImportedModel_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertHelper local_1b0 [8];
  Message local_1a8 [8];
  double local_1a0;
  double local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  Message local_178 [8];
  double local_170;
  double local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  string local_148 [32];
  undefined1 local_128 [8];
  ImportSourcePtr import;
  string local_110 [32];
  undefined1 local_f0 [8];
  ModelPtr model;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  UnitsPtr u2;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Units_checkScalingFactorImportedModel_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"u1",&local_41);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,0x16,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"u2",&local_b1);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"",
             (allocator<char> *)
             ((long)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,0x16,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"model",
             (allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  libcellml::ImportSource::create();
  peVar4 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"I_am_a_url",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::ImportSource::setUrl((string *)peVar4);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  peVar4 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_128);
  libcellml::ImportSource::setModel((shared_ptr *)peVar4);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  local_168 = 1.0;
  local_170 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_20,(shared_ptr *)local_90,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_160,"1.0","libcellml::Units::scalingFactor(u1, u2)",&local_168
             ,&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(local_178);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x580,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_198 = 1.0;
  local_1a0 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_90,(shared_ptr *)local_20,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_190,"1.0","libcellml::Units::scalingFactor(u2, u1)",&local_198
             ,&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x581,pcVar5);
    testing::internal::AssertHelper::operator=(local_1b0,local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1b0);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_128);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_f0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_90);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Units, checkScalingFactorImportedModel)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");
    model->addUnits(u1);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(model);

    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u2, u1));
}